

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  time_t tVar1;
  allocator local_7d1;
  string local_7d0 [32];
  undefined1 local_7b0 [8];
  Player computer;
  allocator local_3f1;
  string local_3f0 [32];
  undefined1 local_3d0 [8];
  Player player;
  Battle battle;
  char goGame;
  
  battle.enemy._4_4_ = 0;
  setlocale(6,"");
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  battle.enemy._3_1_ = '0';
  while (battle.enemy._3_1_ != '3') {
    UI::showMenu((char *)((long)&battle.enemy + 3));
    if (battle.enemy._3_1_ == '1') {
      Battle::Battle((Battle *)&player.field_0x3a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,"human",&local_3f1);
      Player::Player((Player *)local_3d0,(string *)local_3f0);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7d0,"AI",&local_7d1);
      Player::Player((Player *)local_7b0,(string *)local_7d0);
      std::__cxx11::string::~string(local_7d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
      Battle::initPlayers((Battle *)&player.field_0x3a0,(Player *)local_3d0,(Player *)local_7b0);
      Battle::prepareForBattle((Battle *)&player.field_0x3a0);
      Battle::startBattle((Battle *)&player.field_0x3a0);
      Battle::finish((Battle *)&player.field_0x3a0);
      Player::~Player((Player *)local_7b0);
      Player::~Player((Player *)local_3d0);
    }
  }
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    srand(time(NULL));
    char goGame = '0';

    while(goGame != '3')
    {
        UI::showMenu(goGame);
        if(goGame == '1')
        {
            Battle battle;

            Player player("human"), computer("AI");
            battle.initPlayers(player,computer);

            battle.prepareForBattle();
            battle.startBattle();
            battle.finish();
        }

    }

    return 0;
}